

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<long_long,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<long_long,_fmt::v6::basic_format_specs<char>_> *this)

{
  char cVar1;
  format_specs specs;
  string_view prefix;
  num_writer f;
  char cVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  ulong uVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  char *pcVar8;
  reference pcVar9;
  undefined8 uVar10;
  long *in_RDI;
  string_view sVar11;
  const_iterator group;
  int size;
  int num_digits;
  char sep;
  string groups;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffef8;
  locale_ref in_stack_ffffffffffffff00;
  locale_ref in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff7c;
  undefined5 uVar12;
  int local_54;
  undefined8 uVar13;
  undefined7 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc4 [12];
  string local_28 [40];
  
  grouping<char>(in_stack_ffffffffffffff08);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    uVar13 = *(undefined8 *)(*in_RDI + 8);
    cVar2 = thousands_sep<char>(in_stack_ffffffffffffff00);
    if (cVar2 == '\0') {
      on_dec((int_writer<long_long,_fmt::v6::basic_format_specs<char>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    }
    else {
      local_54 = count_digits(in_RDI[2]);
      _Var7._M_current = (char *)std::__cxx11::string::cbegin();
      while( true ) {
        pcVar8 = (char *)std::__cxx11::string::cend();
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffff00.locale_,in_stack_fffffffffffffef8);
        bVar5 = false;
        if (bVar3) {
          pcVar9 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&stack0xffffffffffffffa0);
          bVar5 = false;
          if (*pcVar9 < local_54) {
            pcVar9 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&stack0xffffffffffffffa0);
            bVar5 = false;
            if ('\0' < *pcVar9) {
              pcVar9 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&stack0xffffffffffffffa0);
              cVar1 = *pcVar9;
              cVar4 = max_value<char>();
              bVar5 = cVar1 != cVar4;
            }
          }
        }
        if (!bVar5) break;
        pcVar9 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&stack0xffffffffffffffa0);
        local_54 = local_54 - *pcVar9;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&stack0xffffffffffffffa0);
      }
      uVar10 = std::__cxx11::string::cend();
      bVar5 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffff00.locale_,in_stack_fffffffffffffef8);
      if (bVar5) {
        std::__cxx11::string::back();
      }
      sVar11 = get_prefix((int_writer<long_long,_fmt::v6::basic_format_specs<char>_> *)0x145e60);
      prefix.size_ = (size_t)_Var7._M_current;
      prefix.data_ = pcVar8;
      uVar12 = (undefined5)((ulong)uVar10 >> 0x10);
      specs.type = (char)uVar10;
      specs._9_1_ = (char)((ulong)uVar10 >> 8);
      specs.fill.data_[0] = (char)uVar12;
      specs.fill.data_[1] = (char)((uint5)uVar12 >> 8);
      specs.fill.data_[2] = (char)((uint5)uVar12 >> 0x10);
      specs.fill.data_[3] = (char)((uint5)uVar12 >> 0x18);
      specs.fill.size_ = (char)((uint5)uVar12 >> 0x20);
      specs._15_1_ = (char)((ulong)uVar10 >> 0x38);
      specs.width = (int)sVar11.size_;
      specs.precision = (int)(sVar11.size_ >> 0x20);
      f._8_7_ = in_stack_ffffffffffffffb8;
      f.abs_value = uVar13;
      f._15_1_ = cVar2;
      f.groups._0_4_ = in_stack_ffffffffffffffc0;
      f._20_12_ = in_stack_ffffffffffffffc4;
      basic_writer<fmt::v6::buffer_range<char>>::
      write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<long_long,fmt::v6::basic_format_specs<char>>::num_writer>
                ((basic_writer<fmt::v6::buffer_range<char>_> *)sVar11.data_,
                 in_stack_ffffffffffffff7c,prefix,specs,f);
    }
  }
  else {
    on_dec((int_writer<long_long,_fmt::v6::basic_format_specs<char>_> *)
           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }